

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1driver.c
# Opt level: O0

FT_UInt t1_get_name_index(T1_Face face,FT_String *glyph_name)

{
  int iVar1;
  FT_String *gname;
  FT_Int i;
  FT_String *glyph_name_local;
  T1_Face face_local;
  
  gname._4_4_ = 0;
  while( true ) {
    if ((face->type1).num_glyphs <= (int)gname._4_4_) {
      return 0;
    }
    iVar1 = strcmp(glyph_name,(face->type1).glyph_names[(int)gname._4_4_]);
    if (iVar1 == 0) break;
    gname._4_4_ = gname._4_4_ + 1;
  }
  return gname._4_4_;
}

Assistant:

static FT_UInt
  t1_get_name_index( T1_Face     face,
                     FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)i;
    }

    return 0;
  }